

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MacProj.cpp
# Opt level: O1

void __thiscall MacProj::test_umac_periodic(MacProj *this,int level,MultiFab *u_mac)

{
  BoxArray *this_00;
  Geometry *this_01;
  ostringstream *this_02;
  int iVar1;
  pointer pGVar2;
  undefined8 uVar3;
  undefined8 uVar4;
  undefined8 uVar5;
  FabArrayId fabarrayid;
  int iVar6;
  IntVect *__cur;
  pointer __s;
  ostream *poVar7;
  uint uVar8;
  Box *pBVar9;
  long lVar10;
  uint uVar11;
  FabArray<amrex::FArrayBox> *fabarray;
  ulong uVar12;
  int *piVar13;
  pointer pTVar14;
  long lVar15;
  ulong uVar16;
  long lVar17;
  byte bVar18;
  Real RVar19;
  vector<TURec,_std::allocator<TURec>_> pirm;
  Vector<amrex::IntVect,_std::allocator<amrex::IntVect>_> pshifts;
  Box eBox;
  vector<std::pair<int,_amrex::Box>,_std::allocator<std::pair<int,_amrex::Box>_>_> isects;
  MultiFabId mfid [3];
  Box eDomain;
  int nrecv;
  int local_2b8;
  int local_2b0;
  Vector<int,_std::allocator<int>_> *local_2a0;
  undefined1 local_274 [36];
  MultiFabCopyDescriptor mfcd;
  FArrayBox diff;
  undefined1 local_1b8 [24];
  IndexType IStack_1a0;
  int local_19c;
  int iStack_198;
  int aiStack_194 [2];
  int iStack_18c;
  int local_188;
  int iStack_184;
  undefined8 uStack_180;
  int local_178;
  int iStack_174;
  int iStack_170;
  int iStack_16c;
  int local_168 [2];
  IndexType local_160;
  int local_15c;
  uint local_158;
  
  bVar18 = 0;
  pGVar2 = (this->parent->super_AmrCore).super_AmrMesh.geom.
           super_vector<amrex::Geometry,_std::allocator<amrex::Geometry>_>.
           super__Vector_base<amrex::Geometry,_std::allocator<amrex::Geometry>_>._M_impl.
           super__Vector_impl_data._M_start;
  this_01 = pGVar2 + level;
  if (((*(char *)((long)(pGVar2 + level) + 0x51) != '\0') ||
      ((this_01->super_CoordSys).field_0x52 != '\0')) ||
     ((this_01->super_CoordSys).field_0x53 == '\x01')) {
    amrex::FArrayBox::FArrayBox(&diff);
    amrex::MultiFabCopyDescriptor::MultiFabCopyDescriptor(&mfcd);
    mfid[2].fabArrayId = -1;
    mfid[0].fabArrayId = -1;
    mfid[1].fabArrayId = -1;
    pirm.super__Vector_base<TURec,_std::allocator<TURec>_>._M_impl.super__Vector_impl_data.
    _M_end_of_storage = (pointer)0x0;
    pirm.super__Vector_base<TURec,_std::allocator<TURec>_>._M_impl.super__Vector_impl_data._M_start
         = (pointer)0x0;
    pirm.super__Vector_base<TURec,_std::allocator<TURec>_>._M_impl.super__Vector_impl_data._M_finish
         = (pointer)0x0;
    pshifts.super_vector<amrex::IntVect,_std::allocator<amrex::IntVect>_>.
    super__Vector_base<amrex::IntVect,_std::allocator<amrex::IntVect>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    pshifts.super_vector<amrex::IntVect,_std::allocator<amrex::IntVect>_>.
    super__Vector_base<amrex::IntVect,_std::allocator<amrex::IntVect>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    pshifts.super_vector<amrex::IntVect,_std::allocator<amrex::IntVect>_>.
    super__Vector_base<amrex::IntVect,_std::allocator<amrex::IntVect>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    __s = (pointer)operator_new(0x144);
    pshifts.super_vector<amrex::IntVect,_std::allocator<amrex::IntVect>_>.
    super__Vector_base<amrex::IntVect,_std::allocator<amrex::IntVect>_>._M_impl.
    super__Vector_impl_data._M_finish = __s;
    pshifts.super_vector<amrex::IntVect,_std::allocator<amrex::IntVect>_>.
    super__Vector_base<amrex::IntVect,_std::allocator<amrex::IntVect>_>._M_impl.
    super__Vector_impl_data._M_start = __s;
    pshifts.super_vector<amrex::IntVect,_std::allocator<amrex::IntVect>_>.
    super__Vector_base<amrex::IntVect,_std::allocator<amrex::IntVect>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = __s + 0x1b;
    memset(__s,0,0x144);
    pshifts.super_vector<amrex::IntVect,_std::allocator<amrex::IntVect>_>.
    super__Vector_base<amrex::IntVect,_std::allocator<amrex::IntVect>_>._M_impl.
    super__Vector_impl_data._M_finish = __s + 0x1b;
    isects.
    super__Vector_base<std::pair<int,_amrex::Box>,_std::allocator<std::pair<int,_amrex::Box>_>_>.
    _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    isects.
    super__Vector_base<std::pair<int,_amrex::Box>,_std::allocator<std::pair<int,_amrex::Box>_>_>.
    _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    isects.
    super__Vector_base<std::pair<int,_amrex::Box>,_std::allocator<std::pair<int,_amrex::Box>_>_>.
    _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    lVar17 = 0;
    do {
      if (*(char *)((long)(this_01->super_CoordSys).inv_dx + lVar17 + 0x19) == '\x01') {
        uVar3 = *(undefined8 *)((this_01->domain).smallend.vect + 2);
        uVar4 = *(undefined8 *)((this_01->domain).bigend.vect + 2);
        eDomain.bigend.vect[1] = (int)((ulong)*(undefined8 *)(this_01->domain).bigend.vect >> 0x20);
        eDomain.bigend.vect[2] = (int)uVar4;
        eDomain.btype.itype = SUB84(uVar4,4);
        uVar5 = eDomain._20_8_;
        eDomain.smallend.vect._0_8_ = *(undefined8 *)(this_01->domain).smallend.vect;
        eDomain.smallend.vect[2] = (int)uVar3;
        eDomain.bigend.vect[0] = (int)((ulong)uVar3 >> 0x20);
        eDomain.btype.itype = SUB84(uVar4,4);
        uVar8 = eDomain.btype.itype >> ((uint)lVar17 & 0x1f);
        eDomain._20_8_ = uVar5;
        if ((uVar8 & 1) == 0) {
          piVar13 = eDomain.bigend.vect + lVar17;
          *piVar13 = *piVar13 + 1;
          eDomain.btype.itype = eDomain.btype.itype | 1 << ((byte)lVar17 & 0x1f);
        }
        fabarray = &u_mac[lVar17].super_FabArray<amrex::FArrayBox>;
        fabarrayid = amrex::FabArrayCopyDescriptor<amrex::FArrayBox>::RegisterFabArray
                               (&mfcd.super_FabArrayCopyDescriptor<amrex::FArrayBox>,fabarray);
        mfid[lVar17].fabArrayId = fabarrayid.fabArrayId;
        amrex::MFIter::MFIter((MFIter *)&nrecv,&fabarray->super_FabArrayBase,'\0');
        if (local_2b8 < local_2b0) {
          this_00 = &(fabarray->super_FabArrayBase).boxarray;
          do {
            amrex::BATransformer::operator()
                      (&eBox,&this_00->m_bat,
                       (Box *)((long)(local_2a0->super_vector<int,_std::allocator<int>_>).
                                     super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                     super__Vector_impl_data._M_start[local_2b8] * 0x1c +
                              *(long *)&(((fabarray->super_FabArrayBase).boxarray.m_ref.
                                          super___shared_ptr<amrex::BARef,_(__gnu_cxx::_Lock_policy)2>
                                         ._M_ptr)->m_abox).
                                        super_vector<amrex::Box,_std::allocator<amrex::Box>_>.
                                        super__Vector_base<amrex::Box,_std::allocator<amrex::Box>_>.
                                        _M_impl.super__Vector_impl_data));
            amrex::Geometry::periodicShift(this_01,&eDomain,&eBox,&pshifts);
            uVar8 = (int)((long)pshifts.
                                super_vector<amrex::IntVect,_std::allocator<amrex::IntVect>_>.
                                super__Vector_base<amrex::IntVect,_std::allocator<amrex::IntVect>_>.
                                _M_impl.super__Vector_impl_data._M_finish -
                          (long)pshifts.
                                super_vector<amrex::IntVect,_std::allocator<amrex::IntVect>_>.
                                super__Vector_base<amrex::IntVect,_std::allocator<amrex::IntVect>_>.
                                _M_impl.super__Vector_impl_data._M_start >> 2) * -0x55555555;
            if (0 < (int)uVar8) {
              uVar16 = 0;
              do {
                eBox.smallend.vect[0] =
                     eBox.smallend.vect[0] +
                     pshifts.super_vector<amrex::IntVect,_std::allocator<amrex::IntVect>_>.
                     super__Vector_base<amrex::IntVect,_std::allocator<amrex::IntVect>_>._M_impl.
                     super__Vector_impl_data._M_start[uVar16].vect[0];
                eBox.smallend.vect[1] =
                     eBox.smallend.vect[1] +
                     pshifts.super_vector<amrex::IntVect,_std::allocator<amrex::IntVect>_>.
                     super__Vector_base<amrex::IntVect,_std::allocator<amrex::IntVect>_>._M_impl.
                     super__Vector_impl_data._M_start[uVar16].vect[1];
                eBox.smallend.vect[2] =
                     eBox.smallend.vect[2] +
                     pshifts.super_vector<amrex::IntVect,_std::allocator<amrex::IntVect>_>.
                     super__Vector_base<amrex::IntVect,_std::allocator<amrex::IntVect>_>._M_impl.
                     super__Vector_impl_data._M_start[uVar16].vect[2];
                eBox.bigend.vect[0] =
                     eBox.bigend.vect[0] +
                     pshifts.super_vector<amrex::IntVect,_std::allocator<amrex::IntVect>_>.
                     super__Vector_base<amrex::IntVect,_std::allocator<amrex::IntVect>_>._M_impl.
                     super__Vector_impl_data._M_start[uVar16].vect[0];
                eBox.bigend.vect[1] =
                     eBox.bigend.vect[1] +
                     pshifts.super_vector<amrex::IntVect,_std::allocator<amrex::IntVect>_>.
                     super__Vector_base<amrex::IntVect,_std::allocator<amrex::IntVect>_>._M_impl.
                     super__Vector_impl_data._M_start[uVar16].vect[1];
                eBox.bigend.vect[2] =
                     eBox.bigend.vect[2] +
                     pshifts.super_vector<amrex::IntVect,_std::allocator<amrex::IntVect>_>.
                     super__Vector_base<amrex::IntVect,_std::allocator<amrex::IntVect>_>._M_impl.
                     super__Vector_impl_data._M_start[uVar16].vect[2];
                amrex::BoxArray::intersections(this_00,&eBox,&isects);
                uVar11 = (uint)((ulong)((long)isects.
                                              super__Vector_base<std::pair<int,_amrex::Box>,_std::allocator<std::pair<int,_amrex::Box>_>_>
                                              ._M_impl.super__Vector_impl_data._M_finish -
                                       (long)isects.
                                             super__Vector_base<std::pair<int,_amrex::Box>,_std::allocator<std::pair<int,_amrex::Box>_>_>
                                             ._M_impl.super__Vector_impl_data._M_start) >> 5);
                if (0 < (int)uVar11) {
                  uVar12 = (ulong)(uVar11 & 0x7fffffff);
                  lVar15 = 0;
                  do {
                    piVar13 = (int *)((long)((isects.
                                              super__Vector_base<std::pair<int,_amrex::Box>,_std::allocator<std::pair<int,_amrex::Box>_>_>
                                              ._M_impl.super__Vector_impl_data._M_start)->second).
                                            smallend.vect + lVar15 + -4);
                    pBVar9 = (Box *)(piVar13 + 1);
                    local_160.itype = piVar13[7];
                    iStack_174 = (int)*(undefined8 *)
                                       (pshifts.
                                        super_vector<amrex::IntVect,_std::allocator<amrex::IntVect>_>
                                        .
                                        super__Vector_base<amrex::IntVect,_std::allocator<amrex::IntVect>_>
                                        ._M_impl.super__Vector_impl_data._M_start[uVar16].vect + 1);
                    local_168[0] = (int)*(undefined8 *)(piVar13 + 5) - iStack_174;
                    iStack_170 = (int)((ulong)*(undefined8 *)
                                               (pshifts.
                                                super_vector<amrex::IntVect,_std::allocator<amrex::IntVect>_>
                                                .
                                                super__Vector_base<amrex::IntVect,_std::allocator<amrex::IntVect>_>
                                                ._M_impl.super__Vector_impl_data._M_start[uVar16].
                                                vect + 1) >> 0x20);
                    local_168[1] = (int)((ulong)*(undefined8 *)(piVar13 + 5) >> 0x20) - iStack_170;
                    local_178 = (pBVar9->smallend).vect[0] -
                                pshifts.
                                super_vector<amrex::IntVect,_std::allocator<amrex::IntVect>_>.
                                super__Vector_base<amrex::IntVect,_std::allocator<amrex::IntVect>_>.
                                _M_impl.super__Vector_impl_data._M_start[uVar16].vect[0];
                    iStack_174 = piVar13[2] - iStack_174;
                    iStack_170 = piVar13[3] - iStack_170;
                    iStack_16c = piVar13[4] -
                                 pshifts.
                                 super_vector<amrex::IntVect,_std::allocator<amrex::IntVect>_>.
                                 super__Vector_base<amrex::IntVect,_std::allocator<amrex::IntVect>_>
                                 ._M_impl.super__Vector_impl_data._M_start[uVar16].vect[0];
                    local_15c = (local_2a0->super_vector<int,_std::allocator<int>_>).
                                super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                super__Vector_impl_data._M_start[local_2b8];
                    local_1b8._0_4_ = 1;
                    local_1b8._4_4_ = 1;
                    local_1b8._8_4_ = 1;
                    local_1b8._12_4_ = 0;
                    local_1b8._16_4_ = 0;
                    local_1b8._20_4_ = 0;
                    IStack_1a0.itype = 0;
                    local_19c = -1;
                    iStack_198 = -1;
                    aiStack_194 = *(int (*) [2])(pBVar9->smallend).vect;
                    uStack_180._0_4_ = piVar13[6];
                    uStack_180._4_4_ = piVar13[7];
                    iStack_184 = (int)((ulong)*(undefined8 *)(piVar13 + 4) >> 0x20);
                    iStack_18c = (int)*(undefined8 *)(piVar13 + 3);
                    local_188 = (int)((ulong)*(undefined8 *)(piVar13 + 3) >> 0x20);
                    local_158 = (uint)lVar17;
                    amrex::FabArrayCopyDescriptor<amrex::FArrayBox>::AddBox
                              ((FillBoxId *)local_274,
                               &mfcd.super_FabArrayCopyDescriptor<amrex::FArrayBox>,fabarrayid,
                               pBVar9,(BoxList *)0x0,*piVar13,0,0,1,true);
                    iStack_198 = local_274._32_4_;
                    local_1b8._16_8_ = local_274._16_8_;
                    IStack_1a0.itype = (uint)local_274._24_8_;
                    local_19c = SUB84(local_274._24_8_,4);
                    local_1b8._0_8_ = local_274._0_8_;
                    local_1b8._8_4_ = (undefined4)local_274._8_8_;
                    local_1b8._12_4_ = SUB84(local_274._8_8_,4);
                    if (pirm.super__Vector_base<TURec,_std::allocator<TURec>_>._M_impl.
                        super__Vector_impl_data._M_finish ==
                        pirm.super__Vector_base<TURec,_std::allocator<TURec>_>._M_impl.
                        super__Vector_impl_data._M_end_of_storage) {
                      std::vector<TURec,std::allocator<TURec>>::_M_realloc_insert<TURec_const&>
                                ((vector<TURec,std::allocator<TURec>> *)&pirm,
                                 (iterator)
                                 pirm.super__Vector_base<TURec,_std::allocator<TURec>_>._M_impl.
                                 super__Vector_impl_data._M_finish,(TURec *)local_1b8);
                    }
                    else {
                      piVar13 = (int *)local_1b8;
                      pTVar14 = pirm.super__Vector_base<TURec,_std::allocator<TURec>_>._M_impl.
                                super__Vector_impl_data._M_finish;
                      for (lVar10 = 0x19; lVar10 != 0; lVar10 = lVar10 + -1) {
                        (pTVar14->m_fbid).m_fillBox.smallend.vect[0] = *piVar13;
                        piVar13 = piVar13 + (ulong)bVar18 * -2 + 1;
                        pTVar14 = (pointer)((long)pTVar14 + (ulong)bVar18 * -8 + 4);
                      }
                      pirm.super__Vector_base<TURec,_std::allocator<TURec>_>._M_impl.
                      super__Vector_impl_data._M_finish =
                           pirm.super__Vector_base<TURec,_std::allocator<TURec>_>._M_impl.
                           super__Vector_impl_data._M_finish + 1;
                    }
                    lVar15 = lVar15 + 0x20;
                    uVar12 = uVar12 - 1;
                  } while (uVar12 != 0);
                }
                eBox.smallend.vect[0] =
                     eBox.smallend.vect[0] -
                     pshifts.super_vector<amrex::IntVect,_std::allocator<amrex::IntVect>_>.
                     super__Vector_base<amrex::IntVect,_std::allocator<amrex::IntVect>_>._M_impl.
                     super__Vector_impl_data._M_start[uVar16].vect[0];
                eBox.smallend.vect[1] =
                     eBox.smallend.vect[1] -
                     pshifts.super_vector<amrex::IntVect,_std::allocator<amrex::IntVect>_>.
                     super__Vector_base<amrex::IntVect,_std::allocator<amrex::IntVect>_>._M_impl.
                     super__Vector_impl_data._M_start[uVar16].vect[1];
                eBox.smallend.vect[2] =
                     eBox.smallend.vect[2] -
                     pshifts.super_vector<amrex::IntVect,_std::allocator<amrex::IntVect>_>.
                     super__Vector_base<amrex::IntVect,_std::allocator<amrex::IntVect>_>._M_impl.
                     super__Vector_impl_data._M_start[uVar16].vect[2];
                eBox.bigend.vect[0] =
                     eBox.bigend.vect[0] -
                     pshifts.super_vector<amrex::IntVect,_std::allocator<amrex::IntVect>_>.
                     super__Vector_base<amrex::IntVect,_std::allocator<amrex::IntVect>_>._M_impl.
                     super__Vector_impl_data._M_start[uVar16].vect[0];
                eBox.bigend.vect[1] =
                     eBox.bigend.vect[1] -
                     pshifts.super_vector<amrex::IntVect,_std::allocator<amrex::IntVect>_>.
                     super__Vector_base<amrex::IntVect,_std::allocator<amrex::IntVect>_>._M_impl.
                     super__Vector_impl_data._M_start[uVar16].vect[1];
                eBox.bigend.vect[2] =
                     eBox.bigend.vect[2] -
                     pshifts.super_vector<amrex::IntVect,_std::allocator<amrex::IntVect>_>.
                     super__Vector_base<amrex::IntVect,_std::allocator<amrex::IntVect>_>._M_impl.
                     super__Vector_impl_data._M_start[uVar16].vect[2];
                uVar16 = uVar16 + 1;
              } while (uVar16 != (uVar8 & 0x7fffffff));
            }
            amrex::MFIter::operator++((MFIter *)&nrecv);
          } while (local_2b8 < local_2b0);
        }
        amrex::MFIter::~MFIter((MFIter *)&nrecv);
      }
      lVar17 = lVar17 + 1;
    } while (lVar17 != 3);
    nrecv = (int)((ulong)((long)pirm.super__Vector_base<TURec,_std::allocator<TURec>_>._M_impl.
                                super__Vector_impl_data._M_finish -
                         (long)pirm.super__Vector_base<TURec,_std::allocator<TURec>_>._M_impl.
                               super__Vector_impl_data._M_start) >> 2) * -0x3d70a3d7;
    amrex::ParallelDescriptor::ReduceIntMax(&nrecv);
    if (nrecv != 0) {
      mfcd.super_FabArrayCopyDescriptor<amrex::FArrayBox>.dataAvailable = true;
      if (pirm.super__Vector_base<TURec,_std::allocator<TURec>_>._M_impl.super__Vector_impl_data.
          _M_finish !=
          pirm.super__Vector_base<TURec,_std::allocator<TURec>_>._M_impl.super__Vector_impl_data.
          _M_start) {
        lVar17 = 0x40;
        this_02 = (ostringstream *)(local_1b8 + 0x10);
        uVar16 = 0;
        do {
          iVar1 = *(int *)((long)(&((pirm.super__Vector_base<TURec,_std::allocator<TURec>_>._M_impl.
                                     super__Vector_impl_data._M_start)->m_fbid).m_fillBox + 1) +
                          lVar17 + 4);
          amrex::FArrayBox::resize
                    ((FArrayBox *)&diff.super_BaseFab<double>,
                     (Box *)((long)(&((pirm.super__Vector_base<TURec,_std::allocator<TURec>_>.
                                       _M_impl.super__Vector_impl_data._M_start)->m_fbid).m_fillBox
                                   + -1) + lVar17),1,(Arena *)0x0);
          amrex::FabArrayCopyDescriptor<amrex::FArrayBox>::FillFab
                    (&mfcd.super_FabArrayCopyDescriptor<amrex::FArrayBox>,
                     (FabArrayId)mfid[iVar1].fabArrayId,
                     (FillBoxId *)
                     ((long)((pirm.super__Vector_base<TURec,_std::allocator<TURec>_>._M_impl.
                              super__Vector_impl_data._M_start)->m_fbid).m_fillBox.smallend.vect +
                     lVar17 + -0x40),(FArrayBox *)&diff.super_BaseFab<double>);
          iVar6 = amrex::FabArrayBase::localindex
                            ((FabArrayBase *)(u_mac + iVar1),
                             *(int *)((long)(&((pirm.
                                                super__Vector_base<TURec,_std::allocator<TURec>_>.
                                                _M_impl.super__Vector_impl_data._M_start)->m_fbid).
                                              m_fillBox + 1) + lVar17));
          pBVar9 = &diff.super_BaseFab<double>.domain;
          amrex::BaseFab<double>::minus<(amrex::RunOn)1>
                    (&diff.super_BaseFab<double>,
                     &u_mac[iVar1].super_FabArray<amrex::FArrayBox>.m_fabs_v.
                      super__Vector_base<amrex::FArrayBox_*,_std::allocator<amrex::FArrayBox_*>_>.
                      _M_impl.super__Vector_impl_data._M_start[iVar6]->super_BaseFab<double>,
                     (Box *)((long)((pirm.super__Vector_base<TURec,_std::allocator<TURec>_>._M_impl.
                                     super__Vector_impl_data._M_start)->m_fbid).m_fillBox.smallend.
                                   vect + lVar17),pBVar9,0,0,1);
          RVar19 = amrex::BaseFab<double>::norm<(amrex::RunOn)1>
                             (&diff.super_BaseFab<double>,pBVar9,0,0,1);
          if ((anonymous_namespace)::umac_periodic_test_Tol < RVar19) {
            poVar7 = amrex::OutStream();
            local_1b8._4_4_ = *(int *)(DAT_00756620 + -0x48);
            local_1b8._0_4_ = *(int *)(DAT_00756620 + -0x30);
            local_1b8._8_4_ = SUB84(poVar7,0);
            local_1b8._12_4_ = (undefined4)((ulong)poVar7 >> 0x20);
            std::__cxx11::ostringstream::ostringstream(this_02);
            *(undefined8 *)((long)&IStack_1a0.itype + *(long *)(local_1b8._16_8_ + -0x18)) =
                 *(undefined8 *)
                  ((long)CONCAT44(local_1b8._12_4_,local_1b8._8_4_) +
                  *(long *)(*(long *)CONCAT44(local_1b8._12_4_,local_1b8._8_4_) + -0x18) + 8);
            std::__ostream_insert<char,std::char_traits<char>>((ostream *)this_02,"dir = ",6);
            std::ostream::operator<<(this_02,iVar1);
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)this_02,", diff norm = ",0xe);
            std::ostream::_M_insert<double>(RVar19);
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)this_02," for region: ",0xd);
            amrex::operator<<((ostream *)this_02,
                              (Box *)((long)((pirm.super__Vector_base<TURec,_std::allocator<TURec>_>
                                              ._M_impl.super__Vector_impl_data._M_start)->m_fbid).
                                            m_fillBox.smallend.vect + lVar17));
            std::ios::widen((char)*(undefined8 *)(local_1b8._16_8_ + -0x18) + (char)this_02);
            std::ostream::put((char)this_02);
            std::ostream::flush();
            amrex::Print::~Print((Print *)local_1b8);
            amrex::Error_host("Periodic bust in u_mac");
          }
          uVar16 = uVar16 + 1;
          lVar17 = lVar17 + 100;
        } while (uVar16 < (ulong)(((long)pirm.super__Vector_base<TURec,_std::allocator<TURec>_>.
                                         _M_impl.super__Vector_impl_data._M_finish -
                                   (long)pirm.super__Vector_base<TURec,_std::allocator<TURec>_>.
                                         _M_impl.super__Vector_impl_data._M_start >> 2) *
                                 -0x70a3d70a3d70a3d7));
      }
    }
    if (isects.
        super__Vector_base<std::pair<int,_amrex::Box>,_std::allocator<std::pair<int,_amrex::Box>_>_>
        ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(isects.
                      super__Vector_base<std::pair<int,_amrex::Box>,_std::allocator<std::pair<int,_amrex::Box>_>_>
                      ._M_impl.super__Vector_impl_data._M_start,
                      (long)isects.
                            super__Vector_base<std::pair<int,_amrex::Box>,_std::allocator<std::pair<int,_amrex::Box>_>_>
                            ._M_impl.super__Vector_impl_data._M_end_of_storage -
                      (long)isects.
                            super__Vector_base<std::pair<int,_amrex::Box>,_std::allocator<std::pair<int,_amrex::Box>_>_>
                            ._M_impl.super__Vector_impl_data._M_start);
    }
    if (pshifts.super_vector<amrex::IntVect,_std::allocator<amrex::IntVect>_>.
        super__Vector_base<amrex::IntVect,_std::allocator<amrex::IntVect>_>._M_impl.
        super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(pshifts.super_vector<amrex::IntVect,_std::allocator<amrex::IntVect>_>.
                      super__Vector_base<amrex::IntVect,_std::allocator<amrex::IntVect>_>._M_impl.
                      super__Vector_impl_data._M_start,
                      (long)pshifts.super_vector<amrex::IntVect,_std::allocator<amrex::IntVect>_>.
                            super__Vector_base<amrex::IntVect,_std::allocator<amrex::IntVect>_>.
                            _M_impl.super__Vector_impl_data._M_end_of_storage -
                      (long)pshifts.super_vector<amrex::IntVect,_std::allocator<amrex::IntVect>_>.
                            super__Vector_base<amrex::IntVect,_std::allocator<amrex::IntVect>_>.
                            _M_impl.super__Vector_impl_data._M_start);
    }
    if (pirm.super__Vector_base<TURec,_std::allocator<TURec>_>._M_impl.super__Vector_impl_data.
        _M_start != (pointer)0x0) {
      operator_delete(pirm.super__Vector_base<TURec,_std::allocator<TURec>_>._M_impl.
                      super__Vector_impl_data._M_start,
                      (long)pirm.super__Vector_base<TURec,_std::allocator<TURec>_>._M_impl.
                            super__Vector_impl_data._M_end_of_storage -
                      (long)pirm.super__Vector_base<TURec,_std::allocator<TURec>_>._M_impl.
                            super__Vector_impl_data._M_start);
    }
    amrex::MultiFabCopyDescriptor::~MultiFabCopyDescriptor(&mfcd);
    diff.super_BaseFab<double>._vptr_BaseFab = (_func_int **)&PTR__BaseFab_0074eb90;
    amrex::BaseFab<double>::clear(&diff.super_BaseFab<double>);
  }
  return;
}

Assistant:

void
MacProj::test_umac_periodic (int       level,
                             MultiFab* u_mac)
{
    const Geometry& geom = parent->Geom(level);

    if (!geom.isAnyPeriodic()) return;

    FArrayBox              diff;
    MultiFabCopyDescriptor mfcd;
    MultiFabId             mfid[BL_SPACEDIM];
    std::vector<TURec>     pirm;
    Vector<IntVect>         pshifts(27);
    std::vector< std::pair<int,Box> > isects;


    for (int dim = 0; dim < BL_SPACEDIM; dim++)
    {
        if (geom.isPeriodic(dim))
        {
            Box eDomain = amrex::surroundingNodes(geom.Domain(),dim);

            mfid[dim] = mfcd.RegisterMultiFab(&u_mac[dim]);

            // How to combine pirm into one global pirm?
            // don't think std::vector::push_back() is thread safe
            // #ifdef _OPENMP
            // #pragma omp parallel
            // #endif
            // {
            //             std::vector<TURec>     pirm;
            //             std::vector< std::pair<int,Box> > isects;
            //             Vector<IntVect>         pshifts(27);

            for (MFIter mfi(u_mac[dim]); mfi.isValid(); ++mfi)
            {
                Box eBox = u_mac[dim].boxArray()[mfi.index()];

                geom.periodicShift(eDomain, eBox, pshifts);

                for (int iiv = 0, M = pshifts.size(); iiv < M; iiv++)
                {
                    eBox += pshifts[iiv];

                    u_mac[dim].boxArray().intersections(eBox,isects);

                    for (int i = 0, N = isects.size(); i < N; i++)
                    {
                        const Box& srcBox = isects[i].second;
                        const Box& dstBox = srcBox - pshifts[iiv];

                        TURec r(mfi.index(),dim,srcBox,dstBox);

                        r.m_fbid = mfcd.AddBox(mfid[dim],
                                               srcBox,
                                               0,
                                               isects[i].first,
                                               0,
                                               0,
                                               1);
                        pirm.push_back(r);
                    }

                    eBox -= pshifts[iiv];
                }
            }
            // }// end OMP region
        }
    }

    int nrecv = pirm.size();
    ParallelDescriptor::ReduceIntMax(nrecv);
    if (nrecv == 0)
        //
        // There's no parallel work to do.
        //
        return;

    mfcd.CollectData();

    for (long unsigned int i = 0; i < pirm.size(); i++)
    {
        const int dim = pirm[i].m_dim;

        BL_ASSERT(pirm[i].m_fbid.box() == pirm[i].m_srcBox);
        BL_ASSERT(pirm[i].m_srcBox.sameSize(pirm[i].m_dstBox));
        BL_ASSERT(u_mac[dim].DistributionMap()[pirm[i].m_idx] == ParallelDescriptor::MyProc());

        diff.resize(pirm[i].m_srcBox, 1);

        mfcd.FillFab(mfid[dim], pirm[i].m_fbid, diff);

        diff.minus<RunOn::Host>(u_mac[dim][pirm[i].m_idx],pirm[i].m_dstBox,diff.box(),0,0,1);

        const Real max_norm = diff.norm<RunOn::Host>(0);

        if (max_norm > umac_periodic_test_Tol )
        {
            amrex::Print() << "dir = "         << dim
                           << ", diff norm = " << max_norm
                           << " for region: "  << pirm[i].m_dstBox << std::endl;
            amrex::Error("Periodic bust in u_mac");
        }
    }
}